

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefileCurrent::~cmMakefileCurrent(cmMakefileCurrent *this)

{
  cmFileLockPool *this_00;
  cmake *this_01;
  cmMakefileCurrent *this_local;
  
  this_00 = cmGlobalGenerator::GetFileLockPool(this->GG);
  cmFileLockPool::PopFileScope(this_00);
  cmGlobalGenerator::SetCurrentMakefile(this->GG,this->MF);
  this_01 = cmGlobalGenerator::GetCMakeInstance(this->GG);
  cmake::SetCurrentSnapshot(this_01,this->Snapshot);
  return;
}

Assistant:

~cmMakefileCurrent()
    {
#if defined(CMAKE_BUILD_WITH_CMAKE)
    this->GG->GetFileLockPool().PopFileScope();
#endif
    this->GG->SetCurrentMakefile(this->MF);
    this->GG->GetCMakeInstance()->SetCurrentSnapshot(this->Snapshot);
    }